

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator::GetNumBitsForMessage
          (ImmutableStringFieldLiteGenerator *this)

{
  FieldDescriptor *this_00;
  bool bVar1;
  uint uVar2;
  OneofDescriptor *pOVar3;
  
  this_00 = this->descriptor_;
  bVar1 = FieldDescriptor::has_presence(this_00);
  uVar2 = 0;
  if (bVar1) {
    if ((this_00->field_0x3 & 1) != 0) {
      if ((this_00->field_0x1 & 0x10) == 0) {
        pOVar3 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar3 = (this_00->scope_).containing_oneof;
        if (pOVar3 == (OneofDescriptor *)0x0) {
          protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb31);
        }
      }
      if (pOVar3 == (OneofDescriptor *)0x0) {
LAB_0034d718:
        protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb63);
      }
      if ((pOVar3->field_count_ == 1) && ((pOVar3->fields_->field_0x1 & 2) != 0)) {
        GetNumBitsForMessage();
        goto LAB_0034d718;
      }
    }
    uVar2 = (byte)~this_00->field_0x3 & 1;
  }
  return uVar2;
}

Assistant:

int ImmutableStringFieldLiteGenerator::GetNumBitsForMessage() const {
  return HasHasbit(descriptor_) ? 1 : 0;
}